

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O0

vector_t *** alloc_acc(gauden_t *g,uint32 n_id)

{
  uint32 uVar1;
  void *pvVar2;
  vector_t ***ppppfVar3;
  vector_t ***out;
  float32 *b;
  uint32 tl;
  uint32 vl;
  uint32 l;
  uint32 k;
  uint32 j;
  uint32 i;
  uint32 n_id_local;
  gauden_t *g_local;
  
  b._4_4_ = 0;
  for (k = 0; k < g->n_feat; k = k + 1) {
    b._4_4_ = g->n_density * g->veclen[k] + b._4_4_;
  }
  pvVar2 = __ckd_calloc__((ulong)(n_id * b._4_4_),4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                          ,0x21c);
  ppppfVar3 = (vector_t ***)
              __ckd_calloc_3d__((ulong)n_id,(ulong)g->n_feat,(ulong)g->n_density,8,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                                ,0x221);
  tl = 0;
  for (k = 0; k < n_id; k = k + 1) {
    for (l = 0; l < g->n_feat; l = l + 1) {
      uVar1 = g->veclen[l];
      for (vl = 0; vl < g->n_density; vl = vl + 1) {
        ppppfVar3[k][l][vl] = (vector_t)((long)pvVar2 + (ulong)tl * 4);
        tl = uVar1 + tl;
      }
    }
  }
  if (tl == n_id * b._4_4_) {
    return ppppfVar3;
  }
  __assert_fail("l == tl",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                ,0x230,"vector_t ***alloc_acc(gauden_t *, uint32)");
}

Assistant:

static vector_t ***
alloc_acc(gauden_t *g, uint32 n_id)
{
    uint32 i, j, k, l, vl, tl;
    float32 *b;
    vector_t ***out;

    for (i = 0, tl = 0; i < g->n_feat; i++) {
	tl += g->n_density * g->veclen[i];
    }

    tl *= n_id;

    b = ckd_calloc(tl, sizeof(float32));

    out = (vector_t ***) ckd_calloc_3d(n_id,
				      g->n_feat,
				      g->n_density,
				      sizeof(vector_t));

    for (i = 0, l = 0; i < n_id; i++) {
	for (j = 0; j < g->n_feat; j++) {

	    vl = g->veclen[j];

	    for (k = 0; k < g->n_density; k++) {
		out[i][j][k] = &b[l];
		
		l += vl;
	    }
	}
    }

    assert(l == tl);

    return out;
}